

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrix3x3.h
# Opt level: O0

void __thiscall btMatrix3x3::getRotation(btMatrix3x3 *this,btQuaternion *q)

{
  float fVar1;
  btScalar *pbVar2;
  uint uVar3;
  uint uVar4;
  btQuadWord *in_RSI;
  btVector3 *in_RDI;
  btScalar bVar5;
  float fVar6;
  btScalar s_1;
  int k;
  int j;
  int i;
  btScalar s;
  btScalar temp [4];
  btScalar trace;
  int local_60;
  float local_28 [5];
  float local_14;
  btQuadWord *local_10;
  
  local_10 = in_RSI;
  pbVar2 = btVector3::x(in_RDI);
  fVar1 = *pbVar2;
  pbVar2 = btVector3::y(in_RDI + 1);
  fVar6 = *pbVar2;
  pbVar2 = btVector3::z(in_RDI + 2);
  local_14 = fVar1 + fVar6 + *pbVar2;
  if (local_14 <= 0.0) {
    pbVar2 = btVector3::x(in_RDI);
    fVar1 = *pbVar2;
    pbVar2 = btVector3::y(in_RDI + 1);
    if (*pbVar2 <= fVar1) {
      pbVar2 = btVector3::x(in_RDI);
      fVar1 = *pbVar2;
      pbVar2 = btVector3::z(in_RDI + 2);
      local_60 = 0;
      if (fVar1 < *pbVar2) {
        local_60 = 2;
      }
    }
    else {
      pbVar2 = btVector3::y(in_RDI + 1);
      fVar1 = *pbVar2;
      pbVar2 = btVector3::z(in_RDI + 2);
      local_60 = 1;
      if (fVar1 < *pbVar2) {
        local_60 = 2;
      }
    }
    uVar3 = (local_60 + 1U) % 3;
    uVar4 = (local_60 + 2U) % 3;
    btVector3::operator_cast_to_float_(in_RDI + local_60);
    btVector3::operator_cast_to_float_(in_RDI + (int)uVar3);
    btVector3::operator_cast_to_float_(in_RDI + (int)uVar4);
    bVar5 = btSqrt(0.0);
    local_28[local_60] = bVar5 * 0.5;
    fVar6 = 0.5 / bVar5;
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI + (int)uVar4);
    fVar1 = pbVar2[(int)uVar3];
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI + (int)uVar3);
    local_28[3] = (fVar1 - pbVar2[(int)uVar4]) * fVar6;
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI + (int)uVar3);
    fVar1 = pbVar2[local_60];
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI + local_60);
    local_28[(int)uVar3] = (fVar1 + pbVar2[(int)uVar3]) * fVar6;
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI + (int)uVar4);
    fVar1 = pbVar2[local_60];
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI + local_60);
    local_28[(int)uVar4] = (fVar1 + pbVar2[(int)uVar4]) * fVar6;
  }
  else {
    bVar5 = btSqrt(0.0);
    local_28[3] = bVar5 * 0.5;
    fVar6 = 0.5 / bVar5;
    pbVar2 = btVector3::y(in_RDI + 2);
    fVar1 = *pbVar2;
    pbVar2 = btVector3::z(in_RDI + 1);
    local_28[0] = (fVar1 - *pbVar2) * fVar6;
    pbVar2 = btVector3::z(in_RDI);
    fVar1 = *pbVar2;
    pbVar2 = btVector3::x(in_RDI + 2);
    local_28[1] = (fVar1 - *pbVar2) * fVar6;
    pbVar2 = btVector3::x(in_RDI + 1);
    fVar1 = *pbVar2;
    pbVar2 = btVector3::y(in_RDI);
    local_28[2] = (fVar1 - *pbVar2) * fVar6;
  }
  btQuadWord::setValue(local_10,local_28,local_28 + 1,local_28 + 2,local_28 + 3);
  return;
}

Assistant:

void getRotation(btQuaternion& q) const
	{
#if (defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE))|| defined (BT_USE_NEON)
        btScalar trace = m_el[0].x() + m_el[1].y() + m_el[2].z();
        btScalar s, x;
        
        union {
            btSimdFloat4 vec;
            btScalar f[4];
        } temp;
        
        if (trace > btScalar(0.0)) 
        {
            x = trace + btScalar(1.0);

            temp.f[0]=m_el[2].y() - m_el[1].z();
            temp.f[1]=m_el[0].z() - m_el[2].x();
            temp.f[2]=m_el[1].x() - m_el[0].y();
            temp.f[3]=x;
            //temp.f[3]= s * btScalar(0.5);
        } 
        else 
        {
            int i, j, k;
            if(m_el[0].x() < m_el[1].y()) 
            { 
                if( m_el[1].y() < m_el[2].z() )
                    { i = 2; j = 0; k = 1; }
                else
                    { i = 1; j = 2; k = 0; }
            }
            else
            {
                if( m_el[0].x() < m_el[2].z())
                    { i = 2; j = 0; k = 1; }
                else
                    { i = 0; j = 1; k = 2; }
            }

            x = m_el[i][i] - m_el[j][j] - m_el[k][k] + btScalar(1.0);

            temp.f[3] = (m_el[k][j] - m_el[j][k]);
            temp.f[j] = (m_el[j][i] + m_el[i][j]);
            temp.f[k] = (m_el[k][i] + m_el[i][k]);
            temp.f[i] = x;
            //temp.f[i] = s * btScalar(0.5);
        }

        s = btSqrt(x);
        q.set128(temp.vec);
        s = btScalar(0.5) / s;

        q *= s;
#else    
		btScalar trace = m_el[0].x() + m_el[1].y() + m_el[2].z();

		btScalar temp[4];

		if (trace > btScalar(0.0)) 
		{
			btScalar s = btSqrt(trace + btScalar(1.0));
			temp[3]=(s * btScalar(0.5));
			s = btScalar(0.5) / s;

			temp[0]=((m_el[2].y() - m_el[1].z()) * s);
			temp[1]=((m_el[0].z() - m_el[2].x()) * s);
			temp[2]=((m_el[1].x() - m_el[0].y()) * s);
		} 
		else 
		{
			int i = m_el[0].x() < m_el[1].y() ? 
				(m_el[1].y() < m_el[2].z() ? 2 : 1) :
				(m_el[0].x() < m_el[2].z() ? 2 : 0); 
			int j = (i + 1) % 3;  
			int k = (i + 2) % 3;

			btScalar s = btSqrt(m_el[i][i] - m_el[j][j] - m_el[k][k] + btScalar(1.0));
			temp[i] = s * btScalar(0.5);
			s = btScalar(0.5) / s;

			temp[3] = (m_el[k][j] - m_el[j][k]) * s;
			temp[j] = (m_el[j][i] + m_el[i][j]) * s;
			temp[k] = (m_el[k][i] + m_el[i][k]) * s;
		}
		q.setValue(temp[0],temp[1],temp[2],temp[3]);
#endif
	}